

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void mqc_codemps(opj_mqc_t *mqc)

{
  int *in_RDI;
  
  in_RDI[1] = in_RDI[1] - *(int *)**(undefined8 **)(in_RDI + 0x30);
  if ((in_RDI[1] & 0x8000U) == 0) {
    if ((uint)in_RDI[1] < *(uint *)**(undefined8 **)(in_RDI + 0x30)) {
      in_RDI[1] = *(int *)**(undefined8 **)(in_RDI + 0x30);
    }
    else {
      *in_RDI = *(int *)**(undefined8 **)(in_RDI + 0x30) + *in_RDI;
    }
    **(undefined8 **)(in_RDI + 0x30) = *(undefined8 *)(**(long **)(in_RDI + 0x30) + 8);
    mqc_renorme((opj_mqc_t *)0x16ba45);
  }
  else {
    *in_RDI = *(int *)**(undefined8 **)(in_RDI + 0x30) + *in_RDI;
  }
  return;
}

Assistant:

static void mqc_codemps(opj_mqc_t *mqc) {
	mqc->a -= (*mqc->curctx)->qeval;
	if ((mqc->a & 0x8000) == 0) {
		if (mqc->a < (*mqc->curctx)->qeval) {
			mqc->a = (*mqc->curctx)->qeval;
		} else {
			mqc->c += (*mqc->curctx)->qeval;
		}
		*mqc->curctx = (*mqc->curctx)->nmps;
		mqc_renorme(mqc);
	} else {
		mqc->c += (*mqc->curctx)->qeval;
	}
}